

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O0

SizeT Qentem::StringUtils::Hash<char>(char *key,SizeT length)

{
  uint uVar1;
  uint local_24;
  int local_20;
  SizeT offset;
  SizeT base;
  SizeT hash;
  SizeT highest_bit;
  SizeT length_local;
  char *key_local;
  
  offset = 0xb;
  local_20 = 0x21;
  hash = length;
  for (local_24 = 0; local_24 < hash; local_24 = local_24 + 1) {
    offset = local_20 * local_24 * (int)key[local_24] + offset;
    local_20 = local_24 + local_20;
    if (local_24 != hash) {
      uVar1 = hash ^ local_24;
      local_20 = local_24 + local_20;
      hash = hash - 1;
      offset = (int)key[hash] + uVar1 * offset;
    }
  }
  return offset | 0x80000000;
}

Assistant:

static SizeT Hash(const Char_T *key, SizeT length) noexcept {
    constexpr SizeT highest_bit = (SizeT{1} << ((sizeof(SizeT) * 8) - SizeT{1}));

    SizeT hash   = SizeT{11};
    SizeT base   = SizeT{33};
    SizeT offset = 0;

    while (offset < length) {
        hash += (base * offset * SizeT(key[offset]));
        base += offset;

        if (offset != length) {
            hash *= (length ^ offset);
            base += offset;
            --length;
            hash += SizeT(key[length]);
        }

        ++offset;
    }

    return (hash | highest_bit);
}